

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSparse.cpp
# Opt level: O2

void __thiscall BeliefSparse::Set(BeliefSparse *this,StateDistribution *belief)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar2;
  ulong uVar3;
  double extraout_XMM0_Qa;
  double p;
  value_type local_48;
  sparse_vector_element<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  local_40;
  
  iVar1 = (*belief->_vptr_StateDistribution[4])(belief);
  uVar2 = 0;
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::resize(&this->_m_b,CONCAT44(extraout_var,iVar1),false);
  (this->_m_b).filled_ = 0;
  while( true ) {
    uVar3 = (ulong)uVar2;
    iVar1 = (*belief->_vptr_StateDistribution[4])(belief);
    if (CONCAT44(extraout_var_00,iVar1) == uVar3) break;
    (*belief->_vptr_StateDistribution[2])(belief,uVar3);
    if (0.0 < extraout_XMM0_Qa) {
      local_40.
      super_container_reference<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
      .c_ = &this->_m_b;
      local_40.i_ = uVar3;
      boost::numeric::ublas::
      sparse_vector_element<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
      ::set(&local_40,&local_48);
    }
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void BeliefSparse::Set(const StateDistribution& belief)
{
    _m_b.resize(belief.GetNrStates(),false);
    _m_b.clear();
    
    for(unsigned int i=0;i!=belief.GetNrStates();++i)
    {
        double p=belief.GetProbability(i);
        if(p>0)
            _m_b[i]=p;
    }

}